

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muhash.cpp
# Opt level: O0

void __thiscall Num3072::Multiply(Num3072 *this,Num3072 *a)

{
  long lVar1;
  bool bVar2;
  limb_t *in_RSI;
  Num3072 *in_RDI;
  long in_FS_OFFSET;
  int j_1;
  int i_2;
  int i_1;
  int i;
  int j;
  limb_t d2;
  limb_t d1;
  limb_t d0;
  limb_t c2;
  limb_t c1;
  limb_t c0;
  Num3072 tmp;
  Num3072 *in_stack_fffffffffffffe08;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  int iVar3;
  undefined4 in_stack_fffffffffffffe28;
  int iVar4;
  int in_stack_fffffffffffffe2c;
  int in_stack_fffffffffffffe30;
  int iVar5;
  Num3072 *c1_00;
  limb_t *in_stack_fffffffffffffe48;
  limb_t *n;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  c1_00 = in_RDI;
  Num3072(in_stack_fffffffffffffe08);
  for (iVar5 = 0; iVar5 < 0x2f; iVar5 = iVar5 + 1) {
    n = (limb_t *)0x0;
    in_stack_fffffffffffffe48 = (limb_t *)0x0;
    anon_unknown.dwarf_1ece32d::mul
              ((limb_t *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
               (limb_t *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),in_RDI->limbs
               ,(limb_t *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
    for (in_stack_fffffffffffffe30 = iVar5 + 2; in_stack_fffffffffffffe30 < 0x30;
        in_stack_fffffffffffffe30 = in_stack_fffffffffffffe30 + 1) {
      anon_unknown.dwarf_1ece32d::muladd3
                (in_stack_fffffffffffffe48,c1_00->limbs,in_RSI,
                 (limb_t *)CONCAT44(iVar5,in_stack_fffffffffffffe30),
                 (limb_t *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    }
    in_stack_fffffffffffffe08 = (Num3072 *)&(anonymous_namespace)::MAX_PRIME_DIFF;
    anon_unknown.dwarf_1ece32d::mulnadd3
              (in_RSI,(limb_t *)CONCAT44(iVar5,in_stack_fffffffffffffe30),
               (limb_t *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
               (limb_t *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),in_RDI->limbs
               ,(limb_t *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),n);
    for (in_stack_fffffffffffffe2c = 0; in_stack_fffffffffffffe2c < iVar5 + 1;
        in_stack_fffffffffffffe2c = in_stack_fffffffffffffe2c + 1) {
      anon_unknown.dwarf_1ece32d::muladd3
                (in_stack_fffffffffffffe48,c1_00->limbs,in_RSI,
                 (limb_t *)CONCAT44(iVar5,in_stack_fffffffffffffe30),
                 (limb_t *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    }
    anon_unknown.dwarf_1ece32d::extract3
              (in_RDI->limbs,(limb_t *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10)
               ,in_stack_fffffffffffffe08->limbs,(limb_t *)0x103fc94);
  }
  for (iVar4 = 0; iVar4 < 0x30; iVar4 = iVar4 + 1) {
    anon_unknown.dwarf_1ece32d::muladd3
              (in_stack_fffffffffffffe48,c1_00->limbs,in_RSI,
               (limb_t *)CONCAT44(iVar5,in_stack_fffffffffffffe30),
               (limb_t *)CONCAT44(in_stack_fffffffffffffe2c,iVar4));
  }
  anon_unknown.dwarf_1ece32d::extract3
            (in_RDI->limbs,(limb_t *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
             in_stack_fffffffffffffe08->limbs,(limb_t *)0x103fd45);
  anon_unknown.dwarf_1ece32d::muln2
            ((limb_t *)CONCAT44(in_stack_fffffffffffffe2c,iVar4),
             (limb_t *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),in_RDI->limbs);
  for (iVar3 = 0; iVar3 < 0x30; iVar3 = iVar3 + 1) {
    anon_unknown.dwarf_1ece32d::addnextract2
              ((limb_t *)CONCAT44(in_stack_fffffffffffffe2c,iVar4),
               (limb_t *)CONCAT44(iVar3,in_stack_fffffffffffffe20),in_RDI->limbs,
               (limb_t *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
  }
  bVar2 = IsOverflow((Num3072 *)CONCAT44(iVar5,in_stack_fffffffffffffe30));
  if (bVar2) {
    FullReduce(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Num3072::Multiply(const Num3072& a)
{
    limb_t c0 = 0, c1 = 0, c2 = 0;
    Num3072 tmp;

    /* Compute limbs 0..N-2 of this*a into tmp, including one reduction. */
    for (int j = 0; j < LIMBS - 1; ++j) {
        limb_t d0 = 0, d1 = 0, d2 = 0;
        mul(d0, d1, this->limbs[1 + j], a.limbs[LIMBS + j - (1 + j)]);
        for (int i = 2 + j; i < LIMBS; ++i) muladd3(d0, d1, d2, this->limbs[i], a.limbs[LIMBS + j - i]);
        mulnadd3(c0, c1, c2, d0, d1, d2, MAX_PRIME_DIFF);
        for (int i = 0; i < j + 1; ++i) muladd3(c0, c1, c2, this->limbs[i], a.limbs[j - i]);
        extract3(c0, c1, c2, tmp.limbs[j]);
    }

    /* Compute limb N-1 of a*b into tmp. */
    assert(c2 == 0);
    for (int i = 0; i < LIMBS; ++i) muladd3(c0, c1, c2, this->limbs[i], a.limbs[LIMBS - 1 - i]);
    extract3(c0, c1, c2, tmp.limbs[LIMBS - 1]);

    /* Perform a second reduction. */
    muln2(c0, c1, MAX_PRIME_DIFF);
    for (int j = 0; j < LIMBS; ++j) {
        addnextract2(c0, c1, tmp.limbs[j], this->limbs[j]);
    }

    assert(c1 == 0);
    assert(c0 == 0 || c0 == 1);

    /* Perform up to two more reductions if the internal state has already
     * overflown the MAX of Num3072 or if it is larger than the modulus or
     * if both are the case.
     * */
    if (this->IsOverflow()) this->FullReduce();
    if (c0) this->FullReduce();
}